

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int cbs_get_asn1(CBS *cbs,CBS *out,CBS_ASN1_TAG tag_value,int skip_header)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  CBS *out_00;
  CBS *pCVar4;
  CBS_ASN1_TAG tag;
  size_t header_len;
  CBS throwaway;
  
  out_00 = out;
  if (out == (CBS *)0x0) {
    out_00 = &throwaway;
  }
  iVar2 = CBS_get_any_asn1_element(cbs,out_00,&tag,&header_len);
  iVar3 = 0;
  if ((iVar2 != 0) && (tag == tag_value)) {
    iVar3 = 1;
    if (skip_header != 0) {
      pCVar4 = &throwaway;
      if (out != (CBS *)0x0) {
        pCVar4 = out;
      }
      uVar1 = pCVar4->len;
      if (uVar1 < header_len) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbs.cc"
                      ,0x1c5,"int cbs_get_asn1(CBS *, CBS *, CBS_ASN1_TAG, int)");
      }
      out_00->data = out_00->data + header_len;
      pCVar4->len = uVar1 - header_len;
    }
  }
  return iVar3;
}

Assistant:

static int cbs_get_asn1(CBS *cbs, CBS *out, CBS_ASN1_TAG tag_value,
                        int skip_header) {
  size_t header_len;
  CBS_ASN1_TAG tag;
  CBS throwaway;

  if (out == NULL) {
    out = &throwaway;
  }

  if (!CBS_get_any_asn1_element(cbs, out, &tag, &header_len) ||
      tag != tag_value) {
    return 0;
  }

  if (skip_header && !CBS_skip(out, header_len)) {
    assert(0);
    return 0;
  }

  return 1;
}